

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QCalendarPopup::mousePressEvent(QCalendarPopup *this,QMouseEvent *event)

{
  byte bVar1;
  QWidget *widget;
  QStyle *pQVar2;
  QPoint this_00;
  QStyleOption *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEdit *dateTime;
  QRect arrowRect;
  QStyleOptionComboBox opt;
  QWidget *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  byte bVar3;
  QPoint local_e8;
  QRect local_e0;
  QPointF local_d0;
  undefined1 local_c0 [3];
  undefined1 local_a8 [16];
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::parentWidget((QWidget *)0x562585);
  widget = (QWidget *)qobject_cast<QDateTimeEdit*>((QObject *)0x56258d);
  if (widget != (QWidget *)0x0) {
    memset(local_98,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x5625c2);
    QStyleOption::initFrom(in_RSI,widget);
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QWidget::style(in_stack_fffffffffffffed8);
    local_a8 = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,1,local_98,4,widget);
    this_00 = QRect::topLeft((QRect *)widget);
    QWidget::mapToGlobal(widget,in_RDI);
    QRect::moveTo((QRect *)widget,in_RDI);
    local_d0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x562679);
    _local_c0 = QPointF::toPoint((QPointF *)widget);
    bVar1 = QRect::contains((QPoint *)local_a8,SUB81(local_c0,0));
    bVar3 = 1;
    if ((bVar1 & 1) == 0) {
      local_e0 = QWidget::rect((QWidget *)in_RSI);
      QSinglePointEvent::position((QSinglePointEvent *)0x5626d3);
      local_e8 = QPointF::toPoint((QPointF *)widget);
      bVar3 = QRect::contains((QPoint *)&local_e0,SUB81(&local_e8,0));
    }
    if ((bVar3 & 1) != 0) {
      QWidget::setAttribute((QWidget *)this_00,local_c0._4_4_,local_c0[3]);
    }
    QStyleOptionComboBox::~QStyleOptionComboBox
              ((QStyleOptionComboBox *)CONCAT17(bVar3,in_stack_fffffffffffffee0));
  }
  QWidget::mousePressEvent(widget,(QMouseEvent *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarPopup::mousePressEvent(QMouseEvent *event)
{
    QDateTimeEdit *dateTime = qobject_cast<QDateTimeEdit *>(parentWidget());
    if (dateTime) {
        QStyleOptionComboBox opt;
        opt.initFrom(dateTime);
        QRect arrowRect = dateTime->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                            QStyle::SC_ComboBoxArrow, dateTime);
        arrowRect.moveTo(dateTime->mapToGlobal(arrowRect .topLeft()));
        if (arrowRect.contains(event->globalPosition().toPoint()) || rect().contains(event->position().toPoint()))
            setAttribute(Qt::WA_NoMouseReplay);
    }
    QWidget::mousePressEvent(event);
}